

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ArbitrarySymbolExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference_const*&,slang::SourceRange&>
          (BumpAllocator *this,Scope *args,Symbol *args_1,Type *args_2,
          HierarchicalReference **args_3,SourceRange *args_4)

{
  SourceRange sourceRange;
  ArbitrarySymbolExpression *pAVar1;
  ArbitrarySymbolExpression *in_RCX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Scope *in_R8;
  Symbol *in_R9;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pAVar1 = (ArbitrarySymbolExpression *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  slang::ast::ArbitrarySymbolExpression::ArbitrarySymbolExpression
            (in_RCX,in_R8,in_R9,(Type *)(in_R9->name)._M_len,*(HierarchicalReference **)in_R9,
             sourceRange);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }